

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteEquals
          (WrapperFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  long lVar2;
  
  lVar2 = google::protobuf::FieldDescriptor::message_type();
  TVar1 = FieldDescriptor::type(*(FieldDescriptor **)(lVar2 + 0x28));
  if (TVar1 != TYPE_FLOAT) {
    lVar2 = google::protobuf::FieldDescriptor::message_type();
    FieldDescriptor::type(*(FieldDescriptor **)(lVar2 + 0x28));
  }
  google::protobuf::io::Printer::Print
            ((map *)printer,(char *)&(this->super_FieldGeneratorBase).variables_);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}